

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

bool FileStream_SetCallback
               (TFileStream *pStream,STREAM_DOWNLOAD_CALLBACK pfnCallback,void *pvUserData)

{
  BLOCK_READ p_Var1;
  
  p_Var1 = pStream->BlockRead;
  if (p_Var1 == (BLOCK_READ)0x0) {
    SetLastError(0x5f);
  }
  else {
    pStream[1].StreamRead = (STREAM_READ)pfnCallback;
    pStream[1].StreamResize = (STREAM_RESIZE)pvUserData;
  }
  return p_Var1 != (BLOCK_READ)0x0;
}

Assistant:

bool FileStream_SetCallback(TFileStream * pStream, STREAM_DOWNLOAD_CALLBACK pfnCallback, void * pvUserData)
{
    TBlockStream * pBlockStream = (TBlockStream *)pStream;

    if(pStream->BlockRead == NULL)
    {
        SetLastError(ERROR_NOT_SUPPORTED);
        return false;
    }

    pBlockStream->pfnCallback = pfnCallback;
    pBlockStream->UserData = pvUserData;
    return true;
}